

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

int set_contains_any_cb_iterate(set s,set_key key,set_value value,set_cb_iterate_args args)

{
  uint uVar1;
  
  uVar1 = set_contains(*args,key);
  *(uint *)((long)args + 8) = uVar1;
  return uVar1 ^ 1;
}

Assistant:

static int set_contains_any_cb_iterate(set s, set_key key, set_value value, set_cb_iterate_args args)
{
	set_contains_any_cb_iterator iterator = (set_contains_any_cb_iterator)args;

	(void)s;
	(void)value;

	iterator->result = set_contains(iterator->s, key);

	/* Stop iteration if we found an element */
	return !iterator->result;
}